

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O3

void __thiscall
CaDiCaL::Internal::connect_proof_tracer
          (Internal *this,Tracer *tracer,bool antecedents,bool finalize_clauses)

{
  pointer *pppTVar1;
  iterator __position;
  long lVar2;
  undefined7 in_register_00000011;
  sockaddr *__addr;
  long lVar3;
  Tracer *local_30;
  value_type_conflict5 local_28;
  
  local_30 = tracer;
  new_proof_on_demand(this);
  if ((((int)CONCAT71(in_register_00000011,antecedents) != 0) && (this->lrat == false)) &&
     (this->lratbuilder == (LratBuilder *)0x0)) {
    this->lrat = true;
  }
  if (finalize_clauses) {
    this->frat = true;
  }
  lVar2 = this->vsize * 2;
  lVar3 = (long)this->max_var + 1;
  if (this->vsize != 0) {
    lVar3 = lVar2;
  }
  local_28 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->unit_clauses_idx,lVar3 * 2,&local_28);
  Proof::connect(this->proof,(int)tracer,__addr,(socklen_t)lVar2);
  __position._M_current =
       (this->tracers).super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->tracers).super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CaDiCaL::Tracer*,std::allocator<CaDiCaL::Tracer*>>::
    _M_realloc_insert<CaDiCaL::Tracer*const&>
              ((vector<CaDiCaL::Tracer*,std::allocator<CaDiCaL::Tracer*>> *)&this->tracers,
               __position,&local_30);
  }
  else {
    *__position._M_current = tracer;
    pppTVar1 = &(this->tracers).
                super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  return;
}

Assistant:

void Internal::connect_proof_tracer (Tracer *tracer, bool antecedents,
                                     bool finalize_clauses) {
  new_proof_on_demand ();
  if (antecedents)
    force_lrat ();
  if (finalize_clauses)
    frat = true;
  resize_unit_clauses_idx ();
  proof->connect (tracer);
  tracers.push_back (tracer);
}